

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O1

void If_ManImproveMapping(If_Man_t *p)

{
  If_Cut_t *pCut;
  uint uVar1;
  uint uVar2;
  If_Obj_t *pObj;
  void *pvVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *vFront;
  void **ppvVar6;
  Vec_Ptr_t *vFront_00;
  Vec_Ptr_t *vVisited;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  long lVar9;
  If_Obj_t *pObj_00;
  If_Man_t *pIVar10;
  int iVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  timespec ts;
  long local_60;
  timespec local_50;
  long local_40;
  If_Man_t *local_38;
  
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    local_60 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_60 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  iVar4 = p->pPars->nLutSize;
  vFront = (Vec_Ptr_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < iVar4 - 1U) {
    iVar11 = iVar4;
  }
  vFront->nSize = 0;
  vFront->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar11 * 8);
  }
  vFront->pArray = ppvVar6;
  vFront_00 = (Vec_Ptr_t *)malloc(0x10);
  vFront_00->nSize = 0;
  vFront_00->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar11 << 3);
  }
  vFront_00->pArray = ppvVar6;
  vVisited = (Vec_Ptr_t *)malloc(0x10);
  vVisited->nCap = 100;
  vVisited->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  vVisited->pArray = ppvVar6;
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    local_38 = p;
    do {
      pObj = (If_Obj_t *)pVVar7->pArray[lVar9];
      if (((undefined1  [112])*pObj & (undefined1  [112])0xf) == (undefined1  [112])0x4) {
        pCut = &pObj->CutBest;
        fVar13 = If_CutDelay(p,pObj,pCut);
        (pObj->CutBest).Delay = fVar13;
        if (pObj->Required + p->fEpsilon < fVar13) {
          __assert_fail("pCut->Delay <= pObj->Required + p->fEpsilon",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifReduce.c"
                        ,0x88,
                        "void If_ManImproveNodeExpand(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
        if (pObj->nRefs != 0) {
          local_40 = lVar9;
          fVar14 = If_CutAreaRefed(p,pCut);
          vFront->nSize = 0;
          vFront_00->nSize = 0;
          vVisited->nSize = 0;
          if (0xffffff < *(uint *)&(pObj->CutBest).field_0x1c) {
            uVar12 = 0;
            do {
              iVar11 = *(int *)(&pObj[1].field_0x0 + uVar12 * 4);
              if (((long)iVar11 < 0) || (p->vObjs->nSize <= iVar11)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar3 = p->vObjs->pArray[iVar11];
              if (pvVar3 == (void *)0x0) break;
              uVar1 = vFront->nSize;
              uVar2 = vFront->nCap;
              if (uVar1 == uVar2) {
                if ((int)uVar2 < 0x10) {
                  if (vFront->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar6 = (void **)realloc(vFront->pArray,0x80);
                  }
                  iVar11 = 0x10;
                }
                else {
                  iVar11 = uVar2 * 2;
                  if (iVar11 <= (int)uVar2) goto LAB_00431e8c;
                  if (vFront->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
                  }
                  else {
                    ppvVar6 = (void **)realloc(vFront->pArray,(ulong)uVar2 << 4);
                  }
                }
                vFront->pArray = ppvVar6;
                vFront->nCap = iVar11;
              }
LAB_00431e8c:
              vFront->nSize = uVar1 + 1;
              vFront->pArray[(int)uVar1] = pvVar3;
              uVar1 = vFront_00->nSize;
              uVar2 = vFront_00->nCap;
              if (uVar1 == uVar2) {
                if ((int)uVar2 < 0x10) {
                  if (vFront_00->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar6 = (void **)realloc(vFront_00->pArray,0x80);
                  }
                  iVar11 = 0x10;
                }
                else {
                  iVar11 = uVar2 * 2;
                  if (iVar11 <= (int)uVar2) goto LAB_00431f04;
                  if (vFront_00->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
                  }
                  else {
                    ppvVar6 = (void **)realloc(vFront_00->pArray,(ulong)uVar2 << 4);
                  }
                }
                vFront_00->pArray = ppvVar6;
                vFront_00->nCap = iVar11;
              }
LAB_00431f04:
              p = local_38;
              vFront_00->nSize = uVar1 + 1;
              vFront_00->pArray[(int)uVar1] = pvVar3;
              uVar1 = vVisited->nCap;
              if (vVisited->nSize == uVar1) {
                if ((int)uVar1 < 0x10) {
                  if (vVisited->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
                  }
                  iVar11 = 0x10;
                }
                else {
                  iVar11 = uVar1 * 2;
                  if (iVar11 <= (int)uVar1) goto LAB_00431f7a;
                  if (vVisited->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
                  }
                  else {
                    ppvVar6 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
                  }
                }
                vVisited->pArray = ppvVar6;
                vVisited->nCap = iVar11;
              }
LAB_00431f7a:
              iVar11 = vVisited->nSize;
              vVisited->nSize = iVar11 + 1;
              vVisited->pArray[iVar11] = pvVar3;
              *(byte *)((long)pvVar3 + 1) = *(byte *)((long)pvVar3 + 1) | 1;
              uVar12 = uVar12 + 1;
            } while (uVar12 < (byte)(pObj->CutBest).field_0x1f);
          }
          If_ManImproveMark_rec(p,pObj,vVisited);
          pObj_00 = (If_Obj_t *)pCut;
          pIVar10 = p;
          If_CutAreaDeref(p,pCut);
          if ((long)vFront->nSize < 1) {
            iVar11 = 0;
          }
          else {
            lVar9 = 0;
            iVar11 = 0;
            do {
              pObj_00 = (If_Obj_t *)vFront->pArray[lVar9];
              iVar11 = iVar11 + (uint)(pObj_00->nRefs == 0);
              lVar9 = lVar9 + 1;
            } while (vFront->nSize != lVar9);
          }
          do {
            iVar5 = If_ManImproveNodeFaninCompact_int(pIVar10,pObj_00,iVar4,vFront,vVisited);
          } while (iVar5 != 0);
          if ((long)vFront->nSize < 1) {
            iVar5 = 0;
          }
          else {
            lVar9 = 0;
            iVar5 = 0;
            do {
              iVar5 = iVar5 + (uint)(*(int *)((long)vFront->pArray[lVar9] + 0xc) == 0);
              lVar9 = lVar9 + 1;
            } while (vFront->nSize != lVar9);
          }
          If_CutAreaRef(p,pCut);
          lVar9 = local_40;
          if (iVar11 < iVar5) {
            __assert_fail("CostBef >= CostAft",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifReduce.c"
                          ,0x99,
                          "void If_ManImproveNodeExpand(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
          if (0 < vVisited->nSize) {
            lVar8 = 0;
            do {
              *(uint *)vVisited->pArray[lVar8] = *vVisited->pArray[lVar8] & 0xfffffeff;
              lVar8 = lVar8 + 1;
            } while (lVar8 < vVisited->nSize);
          }
          If_ManImproveNodeUpdate(p,pObj,vFront);
          fVar15 = If_CutDelay(p,pObj,pCut);
          (pObj->CutBest).Delay = fVar15;
          fVar15 = If_CutAreaRefed(p,pCut);
          if ((fVar14 < fVar15) || (pObj->Required + p->fEpsilon < (pObj->CutBest).Delay)) {
            If_ManImproveNodeUpdate(p,pObj,vFront_00);
            fVar15 = If_CutAreaRefed(p,pCut);
            if ((fVar15 != fVar14) || (NAN(fVar15) || NAN(fVar14))) {
              __assert_fail("AreaAft == AreaBef",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifReduce.c"
                            ,0xa6,
                            "void If_ManImproveNodeExpand(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                           );
            }
            (pObj->CutBest).Delay = fVar13;
          }
        }
      }
      lVar9 = lVar9 + 1;
      pVVar7 = p->vObjs;
    } while (lVar9 < pVVar7->nSize);
  }
  if (vFront->pArray != (void **)0x0) {
    free(vFront->pArray);
    vFront->pArray = (void **)0x0;
  }
  free(vFront);
  if (vFront_00->pArray != (void **)0x0) {
    free(vFront_00->pArray);
    vFront_00->pArray = (void **)0x0;
  }
  free(vFront_00);
  if (vVisited->pArray != (void **)0x0) {
    free(vVisited->pArray);
    vVisited->pArray = (void **)0x0;
  }
  free(vVisited);
  pIVar10 = p;
  If_ManComputeRequired(p);
  iVar4 = (int)pIVar10;
  if (p->pPars->fVerbose != 0) {
    Abc_Print(iVar4,"E:  Del = %7.2f.  Ar = %9.1f.  Edge = %8d.  ",(double)p->RequiredGlo,
              (ulong)(uint)p->nNets);
    fVar13 = p->dPower;
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      Abc_Print(iVar4,"Switch = %7.2f.  ",(double)fVar13);
    }
    Abc_Print(iVar4,"Cut = %8d.  ",(ulong)(uint)p->nCutsMerged);
    iVar11 = 3;
    iVar4 = clock_gettime(3,&local_50);
    if (iVar4 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Abc_Print(iVar11,"%s =","T");
    Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar9 + local_60) / 1000000.0);
  }
  return;
}

Assistant:

void If_ManImproveMapping( If_Man_t * p )
{
    abctime clk;

    clk = Abc_Clock();
    If_ManImproveExpand( p, p->pPars->nLutSize );
    If_ManComputeRequired( p );
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "E:  Del = %7.2f.  Ar = %9.1f.  Edge = %8d.  ", 
            p->RequiredGlo, p->AreaGlo, p->nNets );
        if ( p->dPower )
        Abc_Print( 1, "Switch = %7.2f.  ", p->dPower );
        Abc_Print( 1, "Cut = %8d.  ", p->nCutsMerged );
        Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    }
}